

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SynthWidget.cpp
# Opt level: O3

void __thiscall SynthWidget::on_audioRecord_clicked(SynthWidget *this)

{
  QPushButton *pQVar1;
  int *piVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  undefined4 uVar8;
  int iVar9;
  Master *this_00;
  QSettings *pQVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QString fileName;
  QArrayData *local_98;
  char16_t *pcStack_90;
  long local_88;
  anon_union_24_3_e3d07ef4_for_data local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  qsizetype local_28;
  
  bVar7 = SynthRoute::isRecordingAudio(this->synthRoute);
  if (bVar7) {
    pQVar1 = (this->ui->super_Ui_SynthWidget).audioRecord;
    QVar11.m_data = (storage_type *)0x6;
    QVar11.m_size = (qsizetype)&local_78;
    QString::fromUtf8(QVar11);
    local_58.shared = local_78.shared;
    local_58._8_8_ = local_78._8_8_;
    local_58._16_8_ = local_78._16_8_;
    QAbstractButton::setText((QString *)pQVar1);
    if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_58.shared = *(int *)local_58.shared + -1;
      UNLOCK();
      if (*(int *)local_58.shared == 0) {
        QArrayData::deallocate((QArrayData *)local_58.shared,2,8);
      }
    }
    SynthRoute::stopRecordingAudio(this->synthRoute);
  }
  else {
    if (on_audioRecord_clicked()::currentDir == '\0') {
      iVar9 = __cxa_guard_acquire(&on_audioRecord_clicked()::currentDir);
      if (iVar9 != 0) {
        QVar16.m_data = (storage_type *)0x0;
        QVar16.m_size = (qsizetype)&local_78;
        QString::fromUtf8(QVar16);
        on_audioRecord_clicked::currentDir.d.d = (Data *)local_78.shared;
        on_audioRecord_clicked::currentDir.d.ptr = (char16_t *)local_78._8_8_;
        on_audioRecord_clicked::currentDir.d.size = local_78._16_8_;
        __cxa_atexit(QString::~QString,&on_audioRecord_clicked::currentDir,&__dso_handle);
        __cxa_guard_release(&on_audioRecord_clicked()::currentDir);
      }
    }
    this_00 = Master::getInstance();
    pQVar10 = Master::getSettings(this_00);
    QVar12.m_data = (storage_type *)0x19;
    QVar12.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar12);
    local_98 = (QArrayData *)local_58.shared;
    pcStack_90 = (char16_t *)local_58._8_8_;
    local_88 = local_58._16_8_;
    QVariant::QVariant((QVariant *)&local_58,0);
    QSettings::value((QString *)local_78.data,(QVariant *)pQVar10);
    uVar8 = QVariant::toInt((bool *)local_78.data);
    QVariant::~QVariant((QVariant *)&local_78);
    QVariant::~QVariant((QVariant *)&local_58);
    if (local_98 != (QArrayData *)0x0) {
      LOCK();
      (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_98,2,8);
      }
    }
    QVar13.m_data = (storage_type *)0x0;
    QVar13.m_size = (qsizetype)&local_78;
    QString::fromUtf8(QVar13);
    local_98 = (QArrayData *)local_78.shared;
    pcStack_90 = (char16_t *)local_78._8_8_;
    local_88 = local_78._16_8_;
    QVar14.m_data = (storage_type *)0x1e;
    QVar14.m_size = (qsizetype)&local_78;
    QString::fromUtf8(QVar14);
    local_38 = local_78._0_4_;
    uStack_34 = local_78._4_4_;
    uStack_30 = local_78._8_4_;
    uStack_2c = local_78._12_4_;
    local_28 = local_78._16_8_;
    QFileDialog::getSaveFileName
              (&local_58,this,&local_98,&on_audioRecord_clicked::currentDir,&local_38,0,uVar8);
    piVar2 = (int *)CONCAT44(uStack_34,local_38);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(uStack_34,local_38),2,8);
      }
    }
    if (local_98 != (QArrayData *)0x0) {
      LOCK();
      (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_98,2,8);
      }
    }
    if (local_58._16_8_ != 0) {
      QDir::QDir((QDir *)&local_98,(QString *)local_58.data);
      QDir::absolutePath();
      uVar6 = local_78._16_8_;
      uVar5 = local_78._0_8_;
      pcVar4 = on_audioRecord_clicked::currentDir.d.ptr;
      pDVar3 = on_audioRecord_clicked::currentDir.d.d;
      local_78.shared = (PrivateShared *)on_audioRecord_clicked::currentDir.d.d;
      on_audioRecord_clicked::currentDir.d.d = (Data *)uVar5;
      on_audioRecord_clicked::currentDir.d.ptr = (char16_t *)local_78._8_8_;
      local_78._8_8_ = pcVar4;
      local_78._16_8_ = on_audioRecord_clicked::currentDir.d.size;
      on_audioRecord_clicked::currentDir.d.size = uVar6;
      if (pDVar3 != (Data *)0x0) {
        LOCK();
        (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&pDVar3->super_QArrayData,2,8);
        }
      }
      QDir::~QDir((QDir *)&local_98);
      pQVar1 = (this->ui->super_Ui_SynthWidget).audioRecord;
      QVar15.m_data = (storage_type *)0x4;
      QVar15.m_size = (qsizetype)&local_78;
      QString::fromUtf8(QVar15);
      local_98 = (QArrayData *)local_78.shared;
      pcStack_90 = (char16_t *)local_78._8_8_;
      local_88 = local_78._16_8_;
      QAbstractButton::setText((QString *)pQVar1);
      if (local_98 != (QArrayData *)0x0) {
        LOCK();
        (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_98,2,8);
        }
      }
      SynthRoute::startRecordingAudio(this->synthRoute,(QString *)&local_58);
    }
    if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_58.shared = *(int *)local_58.shared + -1;
      UNLOCK();
      if (*(int *)local_58.shared == 0) {
        QArrayData::deallocate((QArrayData *)local_58.shared,2,8);
      }
    }
  }
  return;
}

Assistant:

void SynthWidget::on_audioRecord_clicked() {
	if (synthRoute->isRecordingAudio()) {
		ui->audioRecord->setText("Record");
		synthRoute->stopRecordingAudio();
	} else {
		static QString currentDir = NULL;
		QFileDialog::Options qFileDialogOptions = QFileDialog::Options(Master::getInstance()->getSettings()->value("Master/qFileDialogOptions", 0).toInt());
		QString fileName = QFileDialog::getSaveFileName(this, NULL, currentDir, "*.wav *.raw;;*.wav;;*.raw;;*.*",
			NULL, qFileDialogOptions);
		if (!fileName.isEmpty()) {
			currentDir = QDir(fileName).absolutePath();
			ui->audioRecord->setText("Stop");
			synthRoute->startRecordingAudio(fileName);
		}
	}
}